

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::DetermineAcModel(LTFlightData *this)

{
  iterator *this_00;
  string *__rhs;
  LTAircraft *pLVar1;
  positionTy *this_01;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  reference ppVar5;
  string *__rhs_00;
  string *__lhs;
  double dVar6;
  string prevType;
  
  std::recursive_mutex::lock(&this->dataAccessMutex);
  __rhs = &(this->statData).acTypeIcao;
  std::__cxx11::string::string((string *)&prevType,(string *)__rhs);
  if (dataRefs.cslFixAcIcaoType._M_string_length == 0) {
    if ((prevType._M_string_length == 0) ||
       (bVar2 = std::operator!=(&prevType,&dataRefs.sDefaultCarIcaoType), !bVar2)) {
      ModelIcaoType::getIcaoType(&(this->statData).mdl);
      std::__cxx11::string::_M_assign((string *)__rhs);
      if ((this->statData).acTypeIcao._M_string_length == 0) {
        _Var3 = std::operator==(&prevType,&dataRefs.sDefaultCarIcaoType);
        if (_Var3) {
          pLVar1 = this->pAc;
          if (pLVar1 == (LTAircraft *)0x0) {
            sVar4 = std::deque<positionTy,_std::allocator<positionTy>_>::size(&this->posDeque);
            if ((1 < sVar4) &&
               (((ushort)((this->posDeque).
                          super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur)->f & 0x300) == 0x200)) {
              this_00 = &(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>
                         ._M_impl.super__Deque_impl_data._M_start;
              ppVar5 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                                 (this_00,1);
              if (((ushort)ppVar5->f & 0x300) == 0x200) {
                this_01 = this_00->_M_cur;
                ppVar5 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                                   (this_00,1);
                dVar6 = positionTy::speed_kt(this_01,ppVar5);
                goto joined_r0x00160aac;
              }
            }
          }
          else if ((pLVar1->super_Aircraft).bOnGrnd == true) {
            dVar6 = (pLVar1->speed).currSpeed_kt;
joined_r0x00160aac:
            if (dVar6 <= 80.0) {
              std::__cxx11::string::_M_assign((string *)__rhs);
              goto LAB_001608f6;
            }
          }
        }
        (this->statData).acTypeIcao._M_string_length = 0;
        *(this->statData).acTypeIcao._M_dataplus._M_p = '\0';
        __lhs = &prevType;
        __rhs_00 = __rhs;
        goto LAB_001608fe;
      }
      bVar2 = std::operator!=(&prevType,__rhs);
      if (bVar2) {
        bVar2 = true;
        if ((int)dataRefs.iLogLevel < 2) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                 ,0xa34,"DetermineAcModel",logINFO,
                 "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, but derived %s from mdl text"
                 ,(this->acKey).key._M_dataplus._M_p,(this->statData).man._M_dataplus._M_p,
                 (this->statData).mdl._M_dataplus._M_p,(this->statData).acTypeIcao._M_dataplus._M_p)
          ;
        }
        goto LAB_001609bd;
      }
    }
    bVar2 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)__rhs);
LAB_001608f6:
    __rhs_00 = &prevType;
    __lhs = __rhs;
LAB_001608fe:
    bVar2 = std::operator!=(__lhs,__rhs_00);
  }
LAB_001609bd:
  std::__cxx11::string::~string((string *)&prevType);
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  return bVar2;
}

Assistant:

bool LTFlightData::DetermineAcModel()
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    const std::string prevType = statData.acTypeIcao;

    // Debugging model matching: If the model is fixed, then it is what it is
    if (!dataRefs.cslFixAcIcaoType.empty()) {
        statData.acTypeIcao = dataRefs.cslFixAcIcaoType;
        return statData.acTypeIcao != prevType;
    }
    
    // We don't change the a/c type if it is already something reasonable
    if (!prevType.empty() &&
        prevType != dataRefs.GetDefaultCarIcaoType())
        return false;
    
    // Try finding a CSL model by interpreting the human-readable model text
    statData.acTypeIcao = ModelIcaoType::getIcaoType(statData.mdl);
    if ( !statData.acTypeIcao.empty() )
    {
        // yea, found something by mdl!
        if (prevType != statData.acTypeIcao) {
            LOG_MSG(logINFO,ERR_NO_AC_TYPE_BUT_MDL,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    statData.acTypeIcao.c_str());
            return true;
        }
        return false;
    }
    
    // Ground vehicle maybe? Shall be on the ground then with reasonable speed
    // (The info if this _could_ be a car is delivered by the channels via
    //  the acTypeIcao, here we just validate if the dynamic situation
    //  fits a car.)
    if (prevType == dataRefs.GetDefaultCarIcaoType())
    {
        if ((pAc &&                                 // plane exists?
             pAc->IsOnGrnd() &&                     // must be on ground with reasonable speed
             pAc->GetSpeed_kt() <= MDL_CAR_MAX_TAXI) ||
            (!pAc &&                                // no plane yet:
             posDeque.size() >= 2 &&                // analyse ground status of and speed between first two positions
             posDeque.front().IsOnGnd() && posDeque[1].IsOnGnd() &&
             posDeque.front().speed_kt(posDeque[1]) <= MDL_CAR_MAX_TAXI))
        {
            // We now decide for surface vehicle
            statData.acTypeIcao = dataRefs.GetDefaultCarIcaoType();
            return statData.acTypeIcao != prevType;
        }
    }
            
    // we have no better idea than default
    statData.acTypeIcao.clear();
    return prevType != statData.acTypeIcao;
}